

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O3

BYTE * __thiscall
Js::WebAssemblySharedArrayBuffer::AllocBuffer
          (WebAssemblySharedArrayBuffer *this,uint32 length,uint32 maxLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  HeapAllocator *this_01;
  BYTE *pBVar4;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (maxLength < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x26d,"(maxLength >= length)","maxLength >= length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (maxLength - length != 0) {
    this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    bVar2 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,(ulong)(maxLength - length));
    if (!bVar2) {
      return (BYTE *)0x0;
    }
  }
  local_50 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_8e234c3;
  data.filename._0_4_ = 0x279;
  data.plusSize = (ulong)maxLength;
  this_01 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  pBVar4 = (BYTE *)Memory::HeapAllocator::AllocT<true>(this_01,(ulong)maxLength);
  return pBVar4;
}

Assistant:

BYTE* WebAssemblySharedArrayBuffer::AllocBuffer(uint32 length, uint32 maxLength)
    {
#if ENABLE_FAST_ARRAYBUFFER
        if (CONFIG_FLAG(WasmFastArray))
        {
            return (BYTE*)WasmVirtualAllocator(length);
        }
#endif
#ifdef _WIN32
        if (CONFIG_FLAG(WasmSharedArrayVirtualBuffer))
        {
            return (BYTE*)AllocWrapper(length, maxLength);
        }
#endif
        AssertOrFailFast(maxLength >= length);
        uint32 additionalSize = maxLength - length;
        if (additionalSize > 0)
        {
            // SharedArrayBuffer::Init already requested External Memory for `length`, we need to request the balance
            if (!this->GetRecycler()->RequestExternalMemoryAllocation(additionalSize))
            {
                // Failed to request for more memory
                return nullptr;
            }
        }
        // Allocate the full size of the buffer if we can't do VirtualAlloc
        return HeapNewNoThrowArray(BYTE, maxLength);
    }